

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::VertexIDCase::draw
          (VertexIDCase *this,GLenum mode,GLsizei count,GLenum type,GLvoid *indices,GLint baseVertex
          )

{
  DrawMethod DVar1;
  GLenum GVar2;
  deBool dVar3;
  GLuint local_30;
  GLint local_2c;
  GLint maxElementsVertices;
  GLint baseVertex_local;
  GLvoid *indices_local;
  GLsizei local_18;
  GLenum type_local;
  GLsizei count_local;
  GLenum mode_local;
  VertexIDCase *this_local;
  
  DVar1 = this->m_method;
  local_2c = baseVertex;
  _maxElementsVertices = indices;
  indices_local._4_4_ = type;
  local_18 = count;
  type_local = mode;
  _count_local = this;
  if (DVar1 == DRAWMETHOD_DRAWELEMENTS_BASEVERTEX) {
    do {
      (*this->m_gl->drawElementsBaseVertex)
                (type_local,local_18,indices_local._4_4_,_maxElementsVertices,local_2c);
      GVar2 = (*this->m_gl->getError)();
      glu::checkError(GVar2,"drawElementsBaseVertex(mode, count, type, indices, baseVertex)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawElementsBaseVertexTests.cpp"
                      ,0x11b);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  else if (DVar1 == DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX) {
    do {
      (*this->m_gl->drawElementsInstancedBaseVertex)
                (type_local,local_18,indices_local._4_4_,_maxElementsVertices,1,local_2c);
      GVar2 = (*this->m_gl->getError)();
      glu::checkError(GVar2,
                      "drawElementsInstancedBaseVertex(mode, count, type, indices, 1, baseVertex)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawElementsBaseVertexTests.cpp"
                      ,0x127);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  else if (DVar1 == DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX) {
    local_30 = 0;
    do {
      (*this->m_gl->getIntegerv)(33000,(GLint *)&local_30);
      GVar2 = (*this->m_gl->getError)();
      glu::checkError(GVar2,"getIntegerv(GL_MAX_ELEMENTS_VERTICES, &maxElementsVertices)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawElementsBaseVertexTests.cpp"
                      ,0x121);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    do {
      (*this->m_gl->drawRangeElementsBaseVertex)
                (type_local,0,local_30,local_18,indices_local._4_4_,_maxElementsVertices,local_2c);
      GVar2 = (*this->m_gl->getError)();
      glu::checkError(GVar2,
                      "drawRangeElementsBaseVertex(mode, 0, maxElementsVertices, count, type, indices, baseVertex)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawElementsBaseVertexTests.cpp"
                      ,0x122);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
  }
  return;
}

Assistant:

void VertexIDCase::draw (GLenum mode, GLsizei count, GLenum type, GLvoid* indices, GLint baseVertex)
{
	switch (m_method)
	{
		case gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_BASEVERTEX:
			GLU_CHECK_GLW_CALL(m_gl, drawElementsBaseVertex(mode, count, type, indices, baseVertex));
			break;

		case gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX:
		{
			GLint maxElementsVertices = 0;
			GLU_CHECK_GLW_CALL(m_gl, getIntegerv(GL_MAX_ELEMENTS_VERTICES, &maxElementsVertices));
			GLU_CHECK_GLW_CALL(m_gl, drawRangeElementsBaseVertex(mode, 0, maxElementsVertices, count, type, indices, baseVertex));
			break;
		}

		case gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX:
				GLU_CHECK_GLW_CALL(m_gl, drawElementsInstancedBaseVertex(mode, count, type, indices, 1, baseVertex));
				break;

		default:
			DE_FATAL("Draw method not supported");
	}
}